

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBSRAMPlus.hpp
# Opt level: O0

void __thiscall
Atari2600::Cartridge::CBSRAMPlus::perform_bus_operation
          (CBSRAMPlus *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  ushort uVar1;
  uint8_t *value_local;
  uint16_t address_local;
  BusOperation operation_local;
  CBSRAMPlus *this_local;
  
  uVar1 = address & 0x1fff;
  if ((address & 0x1000) != 0) {
    if ((0x1ff7 < uVar1) && (uVar1 < 0x1ffb)) {
      this->rom_ptr_ = (this->super_BusExtender).rom_base_ + (int)((uVar1 - 0x1ff8) * 0x1000);
    }
    if ((int)operation < 5) {
      *value = this->rom_ptr_[(int)(uVar1 & 0xfff)];
    }
    if (uVar1 < 0x1100) {
      this->ram_[(int)(uVar1 & 0xff)] = *value;
    }
    else if ((uVar1 < 0x1200) && ((int)operation < 5)) {
      *value = this->ram_[(int)(uVar1 & 0xff)];
    }
  }
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			address &= 0x1fff;
			if(!(address & 0x1000)) return;

			if(address >= 0x1ff8 && address <= 0x1ffa) rom_ptr_ = rom_base_ + (address - 0x1ff8) * 4096;

			if(isReadOperation(operation)) {
				*value = rom_ptr_[address & 4095];
			}

			if(address < 0x1100) ram_[address & 0xff] = *value;
			else if(address < 0x1200 && isReadOperation(operation)) *value = ram_[address & 0xff];
		}